

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptLiteral(HlslGrammar *this,TIntermTyped **node)

{
  TIntermConstantUnion *pTVar1;
  TIntermTyped **node_local;
  HlslGrammar *this_local;
  
  switch((this->super_HlslTokenStream).token.tokenClass) {
  case EHTokFloat16Constant:
    pTVar1 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.d,EbtFloat16,
                        &(this->super_HlslTokenStream).token.loc,true);
    *node = &pTVar1->super_TIntermTyped;
    break;
  case EHTokFloatConstant:
    pTVar1 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.d,EbtFloat,
                        &(this->super_HlslTokenStream).token.loc,true);
    *node = &pTVar1->super_TIntermTyped;
    break;
  case EHTokDoubleConstant:
    pTVar1 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.d,EbtDouble,
                        &(this->super_HlslTokenStream).token.loc,true);
    *node = &pTVar1->super_TIntermTyped;
    break;
  case EHTokIntConstant:
    pTVar1 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.i,
                        &(this->super_HlslTokenStream).token.loc,true);
    *node = &pTVar1->super_TIntermTyped;
    break;
  case EHTokUintConstant:
    pTVar1 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.u,
                        &(this->super_HlslTokenStream).token.loc,true);
    *node = &pTVar1->super_TIntermTyped;
    break;
  case EHTokBoolConstant:
    pTVar1 = TIntermediate::addConstantUnion
                       (this->intermediate,(bool)((this->super_HlslTokenStream).token.field_2.b & 1)
                        ,&(this->super_HlslTokenStream).token.loc,true);
    *node = &pTVar1->super_TIntermTyped;
    break;
  case EHTokStringConstant:
    pTVar1 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.string,
                        &(this->super_HlslTokenStream).token.loc,true);
    *node = &pTVar1->super_TIntermTyped;
    break;
  default:
    return false;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  return true;
}

Assistant:

bool HlslGrammar::acceptLiteral(TIntermTyped*& node)
{
    switch (token.tokenClass) {
    case EHTokIntConstant:
        node = intermediate.addConstantUnion(token.i, token.loc, true);
        break;
    case EHTokUintConstant:
        node = intermediate.addConstantUnion(token.u, token.loc, true);
        break;
    case EHTokFloat16Constant:
        node = intermediate.addConstantUnion(token.d, EbtFloat16, token.loc, true);
        break;
    case EHTokFloatConstant:
        node = intermediate.addConstantUnion(token.d, EbtFloat, token.loc, true);
        break;
    case EHTokDoubleConstant:
        node = intermediate.addConstantUnion(token.d, EbtDouble, token.loc, true);
        break;
    case EHTokBoolConstant:
        node = intermediate.addConstantUnion(token.b, token.loc, true);
        break;
    case EHTokStringConstant:
        node = intermediate.addConstantUnion(token.string, token.loc, true);
        break;

    default:
        return false;
    }

    advanceToken();

    return true;
}